

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timBox.c
# Opt level: O3

int Tim_ManBoxInputLast(Tim_Man_t *p,int iBox)

{
  int iVar1;
  int iVar2;
  
  if ((-1 < iBox) && (iBox < p->vBoxes->nSize)) {
    iVar1 = *(int *)((long)p->vBoxes->pArray[(uint)iBox] + 0x1c);
    iVar2 = Tim_ManBoxInputNum(p,iBox);
    return iVar2 + iVar1 + -1;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Tim_ManBoxInputLast( Tim_Man_t * p, int iBox )
{
    return Tim_ManBox(p, iBox)->Inouts[0] + Tim_ManBoxInputNum(p, iBox) - 1;
}